

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O2

void __thiscall ipx::LpSolver::ClearIPMStartingPoint(LpSolver *this)

{
  std::valarray<double>::resize(&this->x_start_,0,0.0);
  std::valarray<double>::resize(&this->xl_start_,0,0.0);
  std::valarray<double>::resize(&this->xu_start_,0,0.0);
  std::valarray<double>::resize(&this->y_start_,0,0.0);
  std::valarray<double>::resize(&this->zl_start_,0,0.0);
  std::valarray<double>::resize(&this->zu_start_,0,0.0);
  return;
}

Assistant:

void LpSolver::ClearIPMStartingPoint() {
    x_start_.resize(0);
    xl_start_.resize(0);
    xu_start_.resize(0);
    y_start_.resize(0);
    zl_start_.resize(0);
    zu_start_.resize(0);
}